

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_filename_journal(char *zFilename)

{
  uint uVar1;
  char *in_RAX;
  char *pcVar2;
  ulong uVar3;
  
  if (zFilename == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = databaseName(in_RAX);
    while( true ) {
      uVar1 = sqlite3Strlen30(pcVar2);
      uVar3 = (ulong)uVar1;
      if (pcVar2[uVar3 + 1] == '\0') break;
      uVar1 = sqlite3Strlen30(pcVar2 + uVar3 + 1);
      pcVar2 = pcVar2 + uVar3 + 1 + (ulong)uVar1 + 1;
    }
    pcVar2 = pcVar2 + uVar3 + 2;
  }
  return pcVar2;
}

Assistant:

SQLITE_API const char *sqlite3_filename_journal(const char *zFilename){
  if( zFilename==0 ) return 0;
  zFilename = databaseName(zFilename);
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( ALWAYS(zFilename) && zFilename[0] ){
    zFilename += sqlite3Strlen30(zFilename) + 1;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return zFilename + 1;
}